

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boss.cpp
# Opt level: O3

void __thiscall
Boss::Boss(Boss *this,string *id,string *name,Address *add,int hw,int sph,int wtd,int wd,
          int numberOfEmployees)

{
  pointer pcVar1;
  string local_d0;
  string local_b0;
  undefined1 local_90 [32];
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  pcVar1 = (id->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + id->_M_string_length);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar1,pcVar1 + name->_M_string_length);
  local_90._0_8_ = local_90 + 0x10;
  pcVar1 = (add->country)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,pcVar1,pcVar1 + (add->country)._M_string_length);
  pcVar1 = (add->city)._M_dataplus._M_p;
  local_70._M_p = (pointer)&local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (add->city)._M_string_length);
  pcVar1 = (add->street)._M_dataplus._M_p;
  local_50._M_p = (pointer)&local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (add->street)._M_string_length);
  Employee::Employee(&this->super_Employee,&local_b0,&local_d0,(Address *)local_90,hw,sph,wtd,wd);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  (this->super_Employee).super_Person._vptr_Person = (_func_int **)&PTR_operator__0010ad88;
  this->numberOfEmployees = numberOfEmployees;
  return;
}

Assistant:

Boss::Boss(const std::string &id, const std::string &name, const Address &add, int hw, int sph, int wtd, int wd,
           int numberOfEmployees) : Employee(id, name, add, hw, sph, wtd, wd), numberOfEmployees(numberOfEmployees) {}